

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

string * __thiscall
Parser::bracketOperatorFix(string *__return_storage_ptr__,Parser *this,string *data)

{
  char cVar1;
  bool bVar2;
  Instruction IVar3;
  int iVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  string *psVar7;
  char cVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  uint currentLayer;
  string newOperator;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bracketOperators;
  key_type local_cc;
  undefined1 *local_c8;
  size_t local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  string local_70;
  string local_50;
  
  local_a8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8;
  uVar9 = 0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_cc = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar5 = data->_M_string_length;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (uVar5 != 0) {
    bVar2 = false;
    do {
      cVar1 = (data->_M_dataplus)._M_p[uVar9];
      bVar2 = (bool)(cVar1 == '\"' ^ bVar2);
      cVar8 = (char)__return_storage_ptr__;
      if (bVar2) {
LAB_0010da28:
        bVar10 = false;
        bVar11 = false;
LAB_0010da2d:
        if ((bVar10) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2)) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar11) {
          std::__cxx11::string::substr((ulong)&local_c8,(ulong)data);
          pmVar6 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_a0,&local_cc);
          std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c8);
          if (local_c8 != local_b8) {
            operator_delete(local_c8);
          }
          std::__cxx11::string::erase
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
          uVar9 = (ulong)((int)uVar9 + 1);
        }
        else {
          if (bVar2) {
            bVar10 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)data);
            IVar3 = stringToInstruction(&local_70);
            bVar10 = IVar3 != NONE;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
          }
          if (!bVar10) goto LAB_0010dc4f;
          std::__cxx11::string::substr((ulong)&local_c8,(ulong)data);
          pmVar6 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_a0,&local_cc);
          if ((pmVar6->_M_string_length != 0) &&
             ((pmVar6 = std::
                        map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_a0,&local_cc), local_c0 != pmVar6->_M_string_length
              || ((local_c0 != 0 &&
                  (iVar4 = bcmp(local_c8,(pmVar6->_M_dataplus)._M_p,local_c0), iVar4 != 0)))))) {
            psVar7 = (string *)__cxa_allocate_exception(0x20);
            *(string **)psVar7 = psVar7 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      (psVar7,"Please only use one operator per bracket at the moment","");
            __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          pmVar6 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_a0,&local_cc);
          std::__cxx11::string::_M_assign((string *)pmVar6);
          std::__cxx11::string::erase
                    ((ulong)__return_storage_ptr__,
                     __return_storage_ptr__->_M_string_length - local_c0);
          if (local_c8 != local_b8) {
            operator_delete(local_c8);
          }
        }
      }
      else if ((cVar1 == ',') || (cVar1 == ')')) {
        pmVar6 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_a0,&local_cc);
        if (pmVar6->_M_string_length != 0) {
          std::__cxx11::string::push_back(cVar8);
          pmVar6 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_a0,&local_cc);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(pmVar6->_M_dataplus)._M_p);
        }
        std::__cxx11::string::push_back(cVar8);
        if ((data->_M_dataplus)._M_p[uVar9] == ')') {
          local_cc = local_cc - 1;
        }
        else {
          pmVar6 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_a0,&local_cc);
          pmVar6->_M_string_length = 0;
          *(pmVar6->_M_dataplus)._M_p = '\0';
        }
      }
      else {
        if (cVar1 != '(') {
          if (uVar5 == uVar9) goto LAB_0010da28;
          std::__cxx11::string::substr((ulong)&local_50,(ulong)data);
          IVar3 = stringToInstruction(&local_50);
          bVar11 = IVar3 != NONE;
          bVar10 = true;
          goto LAB_0010da2d;
        }
        local_cc = local_cc + 1;
        pmVar6 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_a0,&local_cc);
        std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x1107a9);
LAB_0010dc4f:
        std::__cxx11::string::push_back(cVar8);
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      uVar5 = data->_M_string_length;
    } while (uVar9 < uVar5);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::bracketOperatorFix(const std::string &data)
{
    //Convert things like "((1 + 2) + (3 * 4))" to "((1 2 +) (3 4 *) +)"

    std::string returnValue; //Store what the function will return as it's generated
    unsigned int currentLayer = 0; //To keep track of the current bracket layer
    std::map<unsigned int, std::string> bracketOperators; //Keep track of each bracket layer's operator. Map to keep track of multiple layers of brackets. map<LAYER, OPERATOR>
    bool isQuoteOpen = false;

    //Find operators and data
    for(unsigned int a = 0; a < data.size(); a++)
    {
        //If quotation marks
        if(data[a] == '"')
        {
            isQuoteOpen = !isQuoteOpen;
        }

        //If new bracket, update bracket layer and set the layer's default operator (+)
        if(!isQuoteOpen && data[a] == '(')
        {
            currentLayer++;
            bracketOperators[currentLayer] = "";
            returnValue += data[a];
        }

        //If we're exiting a bracket, update the layer and insert a space followed by this layer's operator
        else if(!isQuoteOpen && (data[a] == ')' || data[a] == ','))
        {
            if(!bracketOperators[currentLayer].empty()) //Only add operator to the end if there is one
            {
                returnValue += ' ';
                returnValue += bracketOperators[currentLayer];
            }
            returnValue += data[a];
            if(data[a] == ')')
                currentLayer--;
            else
                bracketOperators[currentLayer].clear();
        }

        //Else if dual-character operator. Temporary fix.
        else if(!isQuoteOpen && a != data.size() && stringToInstruction(data.substr(a, 2)) != Instruction::NONE)
        {
            bracketOperators[currentLayer] = data.substr(a, 2);
            returnValue.erase(returnValue.size()-1, 1);
            a++;
        }

        //Else if a single-character operator, don't add the operator to the return value and store this layer's operator
        else if(!isQuoteOpen && stringToInstruction(data.substr(a, 1)) != Instruction::NONE)
        {
            std::string newOperator = data.substr(a, 1);
            if(!bracketOperators[currentLayer].empty() && newOperator != bracketOperators[currentLayer])
            {
                throw std::string("Please only use one operator per bracket at the moment");
            }

            bracketOperators[currentLayer] = newOperator;
            returnValue.erase(returnValue.size()-newOperator.size(), newOperator.size());
        }

        //Else, store current character. Not important.
        else
        {
            returnValue += data[a];
        }
    }
    return returnValue;
}